

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printSomething.cpp
# Opt level: O3

void print_tool(MatchTool *tool,ostream *os)

{
  pointer pvVar1;
  char cVar2;
  pointer piVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"{",1);
  cVar2 = (char)os;
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  if ((tool->dtran).
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (tool->dtran).
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar5 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os,"\t{",2);
      pvVar1 = (tool->dtran).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar3 = *(pointer *)&pvVar1[uVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl;
      if (*(pointer *)
           ((long)&pvVar1[uVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) !=
          piVar3) {
        uVar6 = 0;
        do {
          std::ostream::operator<<((ostream *)os,piVar3[uVar6]);
          pvVar1 = (tool->dtran).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          piVar3 = *(pointer *)&pvVar1[uVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl;
          uVar4 = (long)*(pointer *)
                         ((long)&pvVar1[uVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl
                         + 8) - (long)piVar3 >> 2;
          if (uVar6 != uVar4 - 1) {
            std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
            pvVar1 = (tool->dtran).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            piVar3 = *(pointer *)
                      &pvVar1[uVar5].super__Vector_base<int,_std::allocator<int>_>._M_impl;
            uVar4 = (long)*(pointer *)
                           ((long)&pvVar1[uVar5].super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl + 8) - (long)piVar3 >> 2;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < uVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"}",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
      std::ostream::put(cVar2);
      std::ostream::flush();
      uVar5 = uVar5 + 1;
      uVar6 = ((long)(tool->dtran).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(tool->dtran).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar5 <= uVar6 && uVar6 - uVar5 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"}\n{",3);
  piVar3 = (tool->targets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((tool->targets).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar3) {
    uVar5 = 0;
    do {
      std::ostream::operator<<((ostream *)os,piVar3[uVar5]);
      piVar3 = (tool->targets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = (long)(tool->targets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar3 >> 2;
      if (uVar5 != uVar6 - 1) {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
        piVar3 = (tool->targets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar6 = (long)(tool->targets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar3 >> 2;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"}",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  return;
}

Assistant:

void print_tool(const MatchTool& tool, std::ostream& os) {
    os << "{" << endl;
    for (int i = 0; i < tool.dtran.size(); i++) {
        os << "\t{";
        for (int j = 0; j < tool.dtran[i].size(); j++) {
            os << tool.dtran[i][j];
            if (j != tool.dtran[i].size() - 1)
                os << ", ";
        }
        os << "}" << endl;
    }
    os << "}\n{";
    for (int i = 0; i < tool.targets.size(); i++) {
        os << tool.targets[i];
        if (i != tool.targets.size() - 1)
            os << ", ";
    }
    os << "}" << endl;

}